

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O2

void * a2p(char *s)

{
  long lVar1;
  anon_union_8_2_f9ecdc5e v;
  
  v.ret = (void *)0x0;
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    v.d[lVar1] = s[lVar1 * 2 + 1] + 0xbfU | s[lVar1 * 2] * '\x10' - 0x10U;
  }
  return v.ret;
}

Assistant:

static void *a2p(const char *s) {
  union { void *ret; unsigned char d[sizeof(void*)]; } v;
  v.ret = 0L;
  int i=0, n=sizeof(void*);
  for (i=0; i<n; i++) {
    v.d[i] = x2i(s[2*i], s[2*i+1]);
  }
  return v.ret;
}